

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_test.cpp
# Opt level: O0

void operations_test<viennamath::ct_constant<8l>,viennamath::ct_constant<8l>>
               (ct_constant<8L> *t,ct_constant<8L> *u,double t2,double u2)

{
  ostream *poVar1;
  ct_constant<8L> *rhs;
  ct_constant<8L> *rhs_00;
  ct_binary_expr<viennamath::ct_constant<8L>,_viennamath::op_div<double>,_viennamath::ct_constant<8L>_>
  local_3a [2];
  ct_binary_expr<viennamath::ct_constant<8L>,_viennamath::op_div<double>,_viennamath::ct_constant<8L>_>
  local_36;
  ct_constant<64L> local_33 [2];
  ct_constant<64L> local_31 [2];
  ct_constant<0L> local_2f [2];
  ct_constant<0L> local_2d [2];
  ct_constant<16L> local_2b [2];
  ct_constant<16L> local_29;
  double local_28;
  double u2_local;
  double t2_local;
  ct_constant<8L> *u_local;
  ct_constant<8L> *t_local;
  
  local_28 = u2;
  u2_local = t2;
  t2_local = (double)u;
  u_local = t;
  poVar1 = std::operator<<((ostream *)&std::cout,"LHS: ");
  poVar1 = viennamath::operator<<(poVar1,u_local);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,u2_local);
  poVar1 = std::operator<<(poVar1,"), RHS: ");
  poVar1 = viennamath::operator<<(poVar1,(ct_constant<8L> *)t2_local);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_28);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  viennamath::operator+<8L,_8L>(u_local,(ct_constant<8L> *)t2_local);
  evaluations_test<viennamath::ct_constant<16l>>(&local_29,u2_local + local_28);
  viennamath::operator+<8L,_8L>((ct_constant<8L> *)t2_local,u_local);
  evaluations_test<viennamath::ct_constant<16l>>(local_2b,local_28 + u2_local);
  viennamath::operator-<8L,_8L>(u_local,(ct_constant<8L> *)t2_local);
  evaluations_test<viennamath::ct_constant<0l>>(local_2d,u2_local - local_28);
  viennamath::operator-<8L,_8L>((ct_constant<8L> *)t2_local,u_local);
  evaluations_test<viennamath::ct_constant<0l>>(local_2f,local_28 - u2_local);
  viennamath::operator*<8L,_8L>(u_local,(ct_constant<8L> *)t2_local);
  evaluations_test<viennamath::ct_constant<64l>>(local_31,u2_local * local_28);
  viennamath::operator*<8L,_8L>((ct_constant<8L> *)t2_local,u_local);
  evaluations_test<viennamath::ct_constant<64l>>(local_33,local_28 * u2_local);
  viennamath::operator/((type *)u_local,(ct_constant<8L> *)t2_local,rhs);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<8l>,viennamath::op_div<double>,viennamath::ct_constant<8l>>>
            (&local_36,u2_local / local_28);
  viennamath::operator/((type *)t2_local,u_local,rhs_00);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<8l>,viennamath::op_div<double>,viennamath::ct_constant<8l>>>
            (local_3a,local_28 / u2_local);
  return;
}

Assistant:

void operations_test(T const & t, U const & u, double t2, double u2)
{
  std::cout << "LHS: " << t << " (" << t2 << "), RHS: " << u << "(" << u2 << ")" << std::endl;
  evaluations_test(t + u, t2 + u2);
  evaluations_test(u + t, u2 + t2);
  evaluations_test(t - u, t2 - u2);
  evaluations_test(u - t, u2 - t2);
  evaluations_test(t * u, t2 * u2);
  evaluations_test(u * t, u2 * t2);
  evaluations_test(t / u, t2 / u2);
  evaluations_test(u / t, u2 / t2);
}